

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

void __thiscall Runtime::Runtime(Runtime *this,Instance *inst,Statistics *stats)

{
  allocator_type local_52;
  allocator_type local_51;
  Settings *local_50;
  Instance *local_48;
  Instance *local_40;
  Instance *local_38;
  
  Instance::Instance(&this->instance,inst);
  Instance::Instance(&this->relaxed_for_ratiotest,0,0);
  local_38 = &this->relaxed_for_ratiotest;
  Instance::Instance(&this->scaled,0,0);
  local_40 = &this->scaled;
  Instance::Instance(&this->perturbed,0,0);
  local_50 = &this->settings;
  Settings::Settings(local_50);
  this->statistics = stats;
  local_48 = &this->perturbed;
  QpVector::QpVector(&this->primal,(this->instance).num_var);
  QpVector::QpVector(&this->rowactivity,(this->instance).num_con);
  QpVector::QpVector(&this->dualvar,(this->instance).num_var);
  QpVector::QpVector(&this->dualcon,(this->instance).num_con);
  this->status = kUndetermined;
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector
            (&this->status_var,(long)(this->instance).num_var,&local_51);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector
            (&this->status_con,(long)(this->instance).num_con,&local_52);
  return;
}

Assistant:

Runtime(Instance& inst, Statistics& stats)
      : instance(inst),
        statistics(stats),
        primal(QpVector(instance.num_var)),
        rowactivity(QpVector(instance.num_con)),
        dualvar(instance.num_var),
        dualcon(instance.num_con),
        status_var(instance.num_var),
        status_con(instance.num_con) {}